

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

void __thiscall ymfm::ymf288::write_data_hi(ymf288 *this,uint8_t data)

{
  ushort uVar1;
  ymfm_interface *pyVar2;
  size_t __n;
  undefined4 uVar3;
  
  uVar1 = this->m_address;
  if ((uVar1 >> 8 & 1) == 0) {
    return;
  }
  __n = (ulong)(this->m_fm).m_clock_prescale << 5;
  uVar3 = 0x10;
  if (((this->m_fm).m_regs.m_regdata[0x20] & 2) == 0) {
    uVar3 = (int)__n;
  }
  if (uVar1 == 0x110) {
    if ((char)data < '\0') {
      (this->m_fm).m_status = '\0';
    }
    else {
      this->m_flag_control = data;
      (this->m_fm).m_irq_mask = ~data & this->m_irq_enable & 3;
    }
    (*(code *)((this->m_fm).m_intf)->m_engine[1]._vptr_ymfm_engine_callbacks)();
  }
  else {
    fm_engine_base<ymfm::opn_registers_base<true>_>::write
              ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,(uint)uVar1,
               (void *)(ulong)data,__n);
  }
  pyVar2 = (this->m_fm).m_intf;
  (*(code *)pyVar2->m_engine[3]._vptr_ymfm_engine_callbacks)(pyVar2,uVar3);
  return;
}

Assistant:

void ymf288::write_data_hi(uint8_t data)
{
	// ignore if paired with upper address
	if (!bitfield(m_address, 8))
		return;

	// wait times are shorter in YMF288 mode
	int busy_cycles = ymf288_mode() ? 16 : 32 * m_fm.clock_prescale();
	if (m_address == 0x110)
	{
		// 110: IRQ flag control
		if (bitfield(data, 7))
			m_fm.set_reset_status(0, 0xff);
		else
		{
			m_flag_control = data;
			m_fm.set_irq_mask(m_irq_enable & ~m_flag_control & 0x03);
		}
	}
	else
	{
		// 100-10F,111-1FF: write to FM
		m_fm.write(m_address, data);
	}

	// mark busy for a bit
	m_fm.intf().ymfm_set_busy_end(busy_cycles);
}